

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O3

void __thiscall
Saturation::SaturationAlgorithm::onClauseReduction
          (SaturationAlgorithm *this,Clause *cl,Clause **replacements,uint numOfReplacements,
          Clause *premise,bool forward)

{
  bool bVar1;
  ClauseIterator CVar2;
  int iVar3;
  ClauseIterator local_40;
  IteratorCore<Kernel::Clause_*> *local_38;
  
  if (premise == (Clause *)0x0) {
    Lib::VirtualIterator<Kernel::Clause_*>::getEmpty();
    if (local_38 == (IteratorCore<Kernel::Clause_*> *)0x0) {
      local_40._core = (IteratorCore<Kernel::Clause_*> *)0x0;
      bVar1 = true;
      goto LAB_00671dd1;
    }
    iVar3 = local_38->_refCnt;
    if (iVar3 == 0) {
      (*local_38->_vptr_IteratorCore[1])(local_38);
      iVar3 = local_38->_refCnt;
    }
    iVar3 = iVar3 + 1;
  }
  else {
    local_38 = (IteratorCore<Kernel::Clause_*> *)
               Lib::FixedSizeAllocator<32UL>::alloc
                         ((FixedSizeAllocator<32UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    local_38->_vptr_IteratorCore = (_func_int **)&PTR__IteratorCore_00b37428;
    *(undefined1 *)&local_38[1]._vptr_IteratorCore = 0;
    *(Clause **)&local_38[1]._refCnt = premise;
    local_38->_refCnt = 1;
    iVar3 = 2;
  }
  local_38->_refCnt = iVar3;
  bVar1 = false;
  local_40._core = local_38;
LAB_00671dd1:
  CVar2._core = local_40._core;
  onClauseReduction(this,cl,replacements,numOfReplacements,&local_40,forward);
  if (!bVar1) {
    iVar3 = (CVar2._core)->_refCnt + -1;
    (CVar2._core)->_refCnt = iVar3;
    if (iVar3 == 0) {
      (*(CVar2._core)->_vptr_IteratorCore[1])(CVar2._core);
      iVar3 = (CVar2._core)->_refCnt;
    }
    (CVar2._core)->_refCnt = iVar3 + -1;
    if (iVar3 + -1 == 0) {
      (*(CVar2._core)->_vptr_IteratorCore[1])(CVar2._core);
    }
  }
  return;
}

Assistant:

void SaturationAlgorithm::onClauseReduction(Clause* cl, Clause **replacements, unsigned numOfReplacements,
                                            Clause* premise, bool forward)
{
  ASS(cl);

  ClauseIterator premises;

  if (premise) {
    premises = pvi(getSingletonIterator(premise));
  }
  else {
    premises = ClauseIterator::getEmpty();
  }

  onClauseReduction(cl, replacements, numOfReplacements, premises, forward);
}